

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPolComponent_VectorImplementation.cpp
# Opt level: O2

Index __thiscall
JPolComponent_VectorImplementation::GetJointActionIndex
          (JPolComponent_VectorImplementation *this,Index jdI)

{
  pointer ppPVar1;
  PolicyPureVector *pPVar2;
  int iVar3;
  Index IVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar7;
  E *this_00;
  Interface_ProblemToPolicyDiscretePure *pIVar8;
  ulong uVar9;
  allocator_type local_1c1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> individualDomainIndices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> individualActionIndices;
  
  pIVar8 = this->_m_PTPDP;
  if (pIVar8 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
    pIVar8 = (this->_m_PTPDPshared).px;
  }
  iVar3 = (*(pIVar8->super_Interface_ProblemToPolicyDiscrete).
            _vptr_Interface_ProblemToPolicyDiscrete[2])(pIVar8,(ulong)this->_m_idc);
  if ((char)iVar3 != '\0') {
    pIVar8 = this->_m_PTPDP;
    if (pIVar8 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
      pIVar8 = (this->_m_PTPDPshared).px;
    }
    iVar3 = (*(pIVar8->super_Interface_ProblemToPolicyDiscrete).
              _vptr_Interface_ProblemToPolicyDiscrete[10])(pIVar8,jdI,(ulong)this->_m_idc);
    uVar5 = 0;
    while( true ) {
      uVar9 = (ulong)uVar5;
      ppPVar1 = (this->_m_indivPols_PolicyPureVector).
                super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->_m_indivPols_PolicyPureVector).
                        super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3) <= uVar9)
      break;
      pPVar2 = ppPVar1[uVar9];
      IVar4 = (**(code **)(*(long *)&(pPVar2->super_PolicyDiscretePure).super_PolicyDiscrete.
                                     super_Policy + 0x40))
                        (pPVar2,*(undefined4 *)(*(long *)CONCAT44(extraout_var,iVar3) + uVar9 * 4));
      this->_m_indivActionIndices[uVar9] = IVar4;
      uVar5 = uVar5 + 1;
    }
    pIVar8 = this->_m_PTPDP;
    if (pIVar8 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
      pIVar8 = (this->_m_PTPDPshared).px;
    }
    IVar4 = (*(pIVar8->super_Interface_ProblemToPolicyDiscrete).
              _vptr_Interface_ProblemToPolicyDiscrete[6])(pIVar8,this->_m_indivActionIndices);
    return IVar4;
  }
  pIVar8 = this->_m_PTPDP;
  if (pIVar8 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
    pIVar8 = (this->_m_PTPDPshared).px;
  }
  (*(pIVar8->super_Interface_ProblemToPolicyDiscrete)._vptr_Interface_ProblemToPolicyDiscrete[9])
            (&individualDomainIndices,pIVar8,jdI,(ulong)this->_m_idc);
  pIVar8 = this->_m_PTPDP;
  if (pIVar8 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
    pIVar8 = (this->_m_PTPDPshared).px;
  }
  iVar3 = (*(pIVar8->super_Interface_ProblemToPolicyDiscrete).
            _vptr_Interface_ProblemToPolicyDiscrete[3])();
  if ((long)individualDomainIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)individualDomainIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start >> 2 == CONCAT44(extraout_var_00,iVar3)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&individualActionIndices,CONCAT44(extraout_var_00,iVar3),&local_1c1);
    uVar5 = 0;
    while( true ) {
      uVar9 = (ulong)uVar5;
      if ((ulong)((long)individualDomainIndices.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)individualDomainIndices.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= uVar9) break;
      pPVar2 = (this->_m_indivPols_PolicyPureVector).
               super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9];
      uVar6 = (**(code **)(*(long *)&(pPVar2->super_PolicyDiscretePure).super_PolicyDiscrete.
                                     super_Policy + 0x40))
                        (pPVar2,individualDomainIndices.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar9]);
      individualActionIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar9] = uVar6;
      uVar5 = uVar5 + 1;
    }
    pIVar8 = this->_m_PTPDP;
    if (pIVar8 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
      pIVar8 = (this->_m_PTPDPshared).px;
    }
    IVar4 = (*(pIVar8->super_Interface_ProblemToPolicyDiscrete).
              _vptr_Interface_ProblemToPolicyDiscrete[7])(pIVar8,&individualActionIndices);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&individualActionIndices.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&individualDomainIndices.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    return IVar4;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&individualActionIndices);
  poVar7 = std::operator<<((ostream *)
                           &individualActionIndices.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,
                           " JPolComponent_VectorImplementation::GetJointActionIndex Dimension ");
  poVar7 = std::operator<<(poVar7,"mismatch, jdI has ");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  poVar7 = std::operator<<(poVar7,"individual actions, but there are ");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::operator<<(poVar7," agents!\n");
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,(stringstream *)&individualActionIndices);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

Index JPolComponent_VectorImplementation::GetJointActionIndex(Index jdI) const
{
    Index ohI, aThisAgent, ja_i;

    // it is possible to cache the joint->individual observ. history mapping
    // If this is done we want to use it by calling 
    //    JointToIndividualObservationHistoryIndicesRef
    // as it is faster.
    // Otherwise we have to use 
    //    JointToIndividualObservationHistoryIndices
    // to avoid a segfault.
    //
    // The mentioned cache is calculated, when generating joint observation
    // histories. This is controlled by the 
    // PlanningUnitMADPDiscreteParameters of the PlanningUnitMADPDiscrete.
    // ( _m_params.GetComputeJointObservationHistories() in particular )

    //if the "Interface_ProblemToPolicyDiscretePure"-implementing object this
    //policy caches joint -> indiv OH indices
    if(GetInterfacePTPDiscretePure()->AreCachedJointToIndivIndices(_m_idc ) )
    {
        const vector<Index> &individualDomainIndices = GetInterfacePTPDiscretePure()->
            JointToIndividualPolicyDomainIndicesRef(jdI, _m_idc );

        //vector<Index> individualActionIndices(individualDomainIndices.size());
        for( Index agentI=0; agentI < _m_indivPols_PolicyPureVector.size() ;  agentI++ )
        {
            ohI=individualDomainIndices[agentI];
            aThisAgent = _m_indivPols_PolicyPureVector[agentI]->
                GetActionIndex(ohI);

            _m_indivActionIndices[agentI]=aThisAgent;
        }
        ja_i = GetInterfacePTPDiscretePure()->IndividualToJointActionIndices(_m_indivActionIndices);
    } 
    else 
    { 
        vector<Index> individualDomainIndices = GetInterfacePTPDiscretePure()->
            JointToIndividualPolicyDomainIndices(jdI,_m_idc);

        size_t nrA = GetInterfacePTPDiscretePure()->GetNrAgents(); 
        if( individualDomainIndices.size() !=
            static_cast<vector<Index>::size_type>(nrA)   ) 
        {
            stringstream ss; 
            ss<<" JPolComponent_VectorImplementation::GetJointActionIndex Dimension "<<
                "mismatch, jdI has " << individualDomainIndices.size() <<
                "individual actions, but there are "<< nrA <<" agents!\n"; 
            throw E(ss); 
        }

        vector<Index> individualActionIndices(individualDomainIndices.size());
        for( Index agentI=0; agentI < individualDomainIndices.size();
             ++agentI )
        {
            ohI=individualDomainIndices[agentI];
            aThisAgent = _m_indivPols_PolicyPureVector[agentI]->GetActionIndex(ohI);
            individualActionIndices[agentI]=aThisAgent;
        }

        ja_i = GetInterfacePTPDiscretePure()->IndividualToJointActionIndices(
            individualActionIndices);

    }

    return(ja_i);
}